

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O0

PCell_conflict gray_find_cell(gray_PWorker worker)

{
  long lVar1;
  PCell_conflict pTVar2;
  long *in_RDI;
  TPos x;
  PCell_conflict cell;
  PCell_conflict *pcell;
  long local_20;
  PCell *local_10;
  
  local_20 = *in_RDI;
  if (in_RDI[6] < local_20) {
    local_20 = in_RDI[6];
  }
  local_10 = (PCell *)(in_RDI[0x20d] + in_RDI[1] * 8);
  while ((pTVar2 = *local_10, pTVar2 != (PCell_conflict)0x0 && (pTVar2->x <= local_20))) {
    if (pTVar2->x == local_20) {
      return pTVar2;
    }
    local_10 = &pTVar2->next;
  }
  if (in_RDI[0xd] < in_RDI[0xc]) {
    lVar1 = in_RDI[0xd];
    in_RDI[0xd] = lVar1 + 1;
    pTVar2 = (PCell_conflict)(in_RDI[0xb] + lVar1 * 0x20);
    pTVar2->x = local_20;
    pTVar2->area = 0;
    pTVar2->cover = 0;
    pTVar2->next = *local_10;
    *local_10 = pTVar2;
    return pTVar2;
  }
  longjmp((__jmp_buf_tag *)(in_RDI + 0x1f2),1);
}

Assistant:

static PCell gray_find_cell(RAS_ARG)
{
    PCell *pcell, cell;
    TPos   x = ras.ex;

    if (x > ras.count_ex) x = ras.count_ex;

    pcell = &ras.ycells[ras.ey];
    for (;;) {
        cell = *pcell;
        if (cell == NULL || cell->x > x) break;

        if (cell->x == x) goto Exit;

        pcell = &cell->next;
    }

    if (ras.num_cells >= ras.max_cells) ft_longjmp(ras.jump_buffer, 1);

    cell = ras.cells + ras.num_cells++;
    cell->x = x;
    cell->area = 0;
    cell->cover = 0;

    cell->next = *pcell;
    *pcell = cell;

Exit:
    return cell;
}